

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

void __thiscall
so_5::disp::active_obj::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::destroy_thread_for_agent
          (dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
           *this,agent_t *agent)

{
  work_thread_shptr_t thread;
  undefined1 local_18 [16];
  
  search_and_remove_agent_from_map
            ((dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
              *)local_18,(agent_t *)this);
  if ((work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>
       *)local_18._0_8_ !=
      (work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>
       *)0x0) {
    LOCK();
    *(undefined4 *)(local_18._0_8_ + 8) = 0;
    UNLOCK();
    reuse::work_thread::demand_queue_details::
    queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
    ::stop_service((queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
                    *)(local_18._0_8_ + 0x10));
    reuse::work_thread::details::
    work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>::
    wait((work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>
          *)local_18._0_8_,this);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._8_8_);
  }
  return;
}

Assistant:

void
		destroy_thread_for_agent( const agent_t & agent ) override
			{
				auto thread = search_and_remove_agent_from_map( agent );
				if( thread )
					shutdown_and_wait( *thread );
			}